

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

int BN_set_bit(BIGNUM *a,int n)

{
  int iVar1;
  BIGNUM *pBVar2;
  uint uVar3;
  
  iVar1 = 0;
  if (-1 < n) {
    uVar3 = (uint)n >> 6;
    iVar1 = a->top;
    if (iVar1 <= (int)uVar3) {
      if (a->dmax <= (int)uVar3) {
        pBVar2 = bn_expand2(a,uVar3 + 1);
        if (pBVar2 == (BIGNUM *)0x0) {
          return 0;
        }
        iVar1 = a->top;
      }
      if (iVar1 <= (int)uVar3) {
        memset(a->d + iVar1,0,(ulong)(uVar3 - iVar1) * 8 + 8);
      }
      a->top = uVar3 + 1;
    }
    a->d[uVar3] = a->d[uVar3] | 1L << ((byte)n & 0x3f);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int BN_set_bit(BIGNUM *a, int n)
{
    int i, j, k;

    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i) {
        if (bn_wexpand(a, i + 1) == NULL)
            return (0);
        for (k = a->top; k < i + 1; k++)
            a->d[k] = 0;
        a->top = i + 1;
    }

    a->d[i] |= (((BN_ULONG)1) << j);
    bn_check_top(a);
    return (1);
}